

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool skip_space(iit *iter,iit *ender)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = iter->_M_current;
  while (pcVar1 = ender->_M_current, pcVar3 != pcVar1) {
    iVar2 = isspace((int)*pcVar3);
    if (iVar2 == 0) break;
    pcVar3 = pcVar3 + 1;
    iter->_M_current = pcVar3;
  }
  return pcVar3 != pcVar1;
}

Assistant:

bool skip_space(iit &iter, iit &ender) {
    while (iter != ender) {
        if (! std::isspace(*iter)) break;
        ++iter;
    }
    if (iter == ender) return false;
    
    return true;
}